

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

char * CVmObjBigNum::cache_dbl_min(void)

{
  ushort *ext;
  CVmBigNumCache *pCVar1;
  int iVar2;
  
  pCVar1 = S_bignum_cache;
  iVar2 = CVmBigNumCacheReg::alloc_mem(&S_bignum_cache->dbl_min_,0xd);
  ext = (ushort *)(pCVar1->dbl_min_).buf_;
  if (ext != (ushort *)0x0) {
    if ((iVar2 != 0) || (*ext < 0xf)) {
      *ext = 0xf;
      set_double_val((char *)ext,2.2250738585072014e-308);
    }
    return (char *)ext;
  }
  err_throw(0xca);
}

Assistant:

const char *CVmObjBigNum::cache_dbl_min()
{
    /* get the cache register; use the platform precision for a double */
    size_t prec = DBL_DIG;
    int expanded;
    char *ext = S_bignum_cache->get_dbl_min_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* if we got a previously cached value, return it */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* we allocated or reallocated the register, so set the new precision */
    set_prec(ext, prec);

    /* store DBL_MIN in the register */
    set_double_val(ext, DBL_MIN);

    /* return the register */
    return ext;
}